

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O3

int __thiscall
Rml::StringUtilities::ConvertByteOffsetToCharacterOffset
          (StringUtilities *this,StringView string,int byte_offset)

{
  int iVar1;
  StringIteratorU8 it;
  StringIteratorU8 local_38;
  
  StringIteratorU8::StringIteratorU8(&local_38,(char *)this,(char *)this,string.p_begin);
  iVar1 = 0;
  if ((local_38.p != local_38.view.p_begin + -1) && (iVar1 = 0, local_38.p != local_38.view.p_end))
  {
    iVar1 = 0;
    while ((long)local_38.p - (long)local_38.view.p_begin < (long)(int)string.p_end) {
      iVar1 = iVar1 + 1;
      StringIteratorU8::operator++(&local_38);
      if (local_38.p == local_38.view.p_begin + -1) {
        return iVar1;
      }
      if (local_38.p == local_38.view.p_end) {
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

int StringUtilities::ConvertByteOffsetToCharacterOffset(StringView string, int byte_offset)
{
	int character_count = 0;
	for (auto it = StringIteratorU8(string.begin(), string.begin(), string.end()); it; ++it)
	{
		if (it.offset() >= byte_offset)
			break;
		character_count += 1;
	}
	return character_count;
}